

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

TestFactoryBase * __thiscall
testing::internal::
TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
::CreateTestFactory(TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
                    *this,ParamType *parameter)

{
  pointer pcVar1;
  TestFactoryBase *pTVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pTVar2 = (TestFactoryBase *)operator_new(0x28);
  pcVar1 = (parameter->test_name)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (parameter->test_name)._M_string_length);
  pTVar2->_vptr_TestFactoryBase = (_func_int **)&PTR__ParameterizedTestFactory_018e8458;
  pTVar2[1]._vptr_TestFactoryBase = (_func_int **)(pTVar2 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar2 + 1),local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return pTVar2;
}

Assistant:

TestFactoryBase* CreateTestFactory(ParamType parameter) override {
    return new ParameterizedTestFactory<TestSuite>(parameter);
  }